

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

bool __thiscall diy::detail::Div<int>::operator<(Div<int> *this,Div<int> rhs)

{
  Div<int> *this_local;
  Div<int> rhs_local;
  bool local_1;
  
  if (this->b_size == rhs.b_size) {
    rhs_local.nb = rhs.nb;
    if (this->nb == rhs_local.nb) {
      rhs_local.dim = rhs.dim;
      local_1 = this->dim < rhs_local.dim;
    }
    else {
      local_1 = this->nb < rhs_local.nb;
    }
  }
  else {
    local_1 = rhs.b_size < this->b_size;
  }
  return local_1;
}

Assistant:

bool operator<(Div rhs) const
    {
        // sort on second value of the pair unless tied, in which case sort on first
        if (b_size == rhs.b_size)
        {
            if (nb == rhs.nb)
                return(dim < rhs.dim);
            return(nb < rhs.nb);
        }
        return(b_size > rhs.b_size);
    }